

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unitroot.c
# Opt level: O0

void ur_df(double *y,int N,char *alternative,int *klag,double *statistic,double *pval)

{
  int iVar1;
  int iVar2;
  int N_00;
  int p_00;
  double *oup;
  void *__src;
  double *res_00;
  double *y_00;
  void *__src_00;
  double *xin;
  double dVar3;
  int local_2bc;
  double local_2b8;
  double dftable [48];
  double prob [8];
  double nT [6];
  double interp;
  double ssr;
  double alpha;
  reg_object fit;
  double *tablep;
  double *varcovar;
  double *tt;
  double *Y;
  double *XX;
  double *res;
  double *z;
  double *x;
  int iter;
  int Nout;
  int tN;
  int pN;
  int k;
  int p;
  int N2;
  int j;
  int i;
  int N1;
  int lags;
  int lag;
  double *pval_local;
  double *statistic_local;
  int *klag_local;
  char *alternative_local;
  int N_local;
  double *y_local;
  
  memset(prob + 7,0,0x30);
  prob[7] = 25.0;
  memcpy(dftable + 0x2f,&DAT_0017adb0,0x40);
  memcpy(&local_2b8,&DAT_0017adf0,0x180);
  if (klag == (int *)0x0) {
    dVar3 = pow((double)N - 1.0,0.3333333333333333);
    local_2bc = (int)dVar3;
  }
  else {
    local_2bc = *klag;
  }
  iVar1 = local_2bc + 1;
  iVar2 = N + -1;
  N_00 = (iVar2 - iVar1) + 1;
  oup = (double *)malloc((long)iVar2 << 3);
  __src = malloc((long)((iVar2 - iVar1) + 1) * 8 * (long)iVar1);
  res_00 = (double *)malloc((long)N_00 << 3);
  y_00 = (double *)malloc((long)N_00 << 3);
  __src_00 = malloc((long)N_00 << 3);
  xin = (double *)malloc(0x40);
  diff(y,N,1,oup);
  for (N2 = 0; N2 < iVar1; N2 = N2 + 1) {
    for (p = 0; p < N_00; p = p + 1) {
      *(double *)((long)__src + (long)(N2 * N_00 + p) * 8) = oup[((iVar1 + p) - N2) + -1];
    }
  }
  memcpy(y_00,__src,(long)N_00 << 3);
  for (N2 = 0; N2 < N_00; N2 = N2 + 1) {
    *(double *)((long)__src_00 + (long)N2 * 8) = (double)(N2 + iVar1);
  }
  if (iVar1 < 2) {
    Y = (double *)malloc((long)N_00 * 0x18);
    tablep = (double *)malloc(0x48);
    alpha = (double)reg_init(N_00,3);
    memcpy(Y,y + (long)iVar1 + -1,(long)N_00 << 3);
    memcpy(Y + N_00,__src_00,(long)N_00 << 3);
    regress((reg_object)alpha,Y,y_00,res_00,tablep,0.95);
  }
  else {
    p_00 = local_2bc + 3;
    Y = (double *)malloc((long)N_00 * 8 * (long)p_00);
    tablep = (double *)malloc((long)p_00 * 8 * (long)p_00);
    alpha = (double)reg_init(N_00,p_00);
    memcpy(Y,y + (long)iVar1 + -1,(long)N_00 << 3);
    memcpy(Y + N_00,__src_00,(long)N_00 << 3);
    memcpy(Y + N_00 * 2,(void *)((long)__src + (long)N_00 * 8),(long)N_00 * 8 * (long)local_2bc);
    regress((reg_object)alpha,Y,y_00,res_00,tablep,0.95);
  }
  *statistic = *(double *)((long)alpha + 0xd0) / *(double *)((long)alpha + 0xe8);
  for (N2 = 0; N2 < 8; N2 = N2 + 1) {
    dVar3 = interpolate_linear(prob + 7,dftable + (long)(N2 * 6) + -1,6,(double)iVar2);
    xin[N2] = dVar3;
  }
  dVar3 = interpolate_linear(xin,dftable + 0x2f,8,*statistic);
  iVar1 = strcmp(alternative,"stationary");
  if (iVar1 == 0) {
    *pval = dVar3;
  }
  else {
    iVar1 = strcmp(alternative,"explosive");
    if (iVar1 != 0) {
      printf("alternative accepts only two values - stationary and explosive \n");
      exit(-1);
    }
    *pval = 1.0 - dVar3;
  }
  if (klag != (int *)0x0) {
    *klag = local_2bc;
  }
  free(oup);
  free(__src);
  free(res_00);
  free(y_00);
  free(__src_00);
  free(Y);
  free(tablep);
  free(xin);
  free_reg((reg_object)alpha);
  return;
}

Assistant:

void ur_df(double *y, int N,const char* alternative, int *klag, double *statistic,double *pval) {
    /*
    y - Time Series data of length N
    alternative - "stationary" or "explosive"

    klag - Length of the lag. Uses pow((double)N - 1.0, 1.0/3.0) if klag == NULL
    Outputs

    statistic - Test statistic
    pval - p-value used to determine null hypothesis

    */
    int lag,lags,N1,i,j,N2,p,k,pN,tN,Nout,iter;
    double *x,*z,*res,*XX,*Y,*tt,*varcovar,*tablep;
    reg_object fit;
    double alpha,ssr,interp;
    double nT[6] = {25, 50, 100, 250, 500, 100000};
    double prob[8] ={0.01, 0.025, 0.05, 0.10, 0.90, 0.95, 0.975, 0.99};
    double dftable[48] = {-4.38, -4.15, -4.04, -3.99, -3.98, -3.96,-3.95, -3.80, -3.73, -3.69, -3.68, -3.66,-3.60, -3.50, -3.45,
     -3.43, -3.42, -3.41,-3.24, -3.18, -3.15, -3.13, -3.13, -3.12,-1.14, -1.19, -1.22, -1.23, -1.24, -1.25,-0.80, -0.87, -0.90, -0.92,
      -0.93, -0.94,-0.50, -0.58, -0.62, -0.64, -0.65, -0.66,-0.15, -0.24, -0.28, -0.31, -0.32, -0.33};// 8X6

    pN = 8;
    tN = 6;
    Nout = 50;

    lags = (klag == NULL) ? (int) pow((double)N - 1.0, 1.0/3.0) : *klag;

    alpha = 0.95;
    lag = lags;
    lags++;
    N1 = N - 1;
    N2 = N1 - lags + 1;

    z = (double*)malloc(sizeof(double)*N1);
    x = (double*)malloc(sizeof(double)*(N1-lags+1)*lags);
    res = (double*)malloc(sizeof(double)*N2);
    Y = (double*)malloc(sizeof(double)*N2);
    tt = (double*)malloc(sizeof(double)*N2);
    tablep = (double*)malloc(sizeof(double)*pN);

    diff(y,N,1,z);// z = y(t) - y(t-1)

    //mdisplay(z,1,N1);
    
    for(i = 0; i < lags;++i) {
        for(j = 0;j < N2;++j) {
            x[i*N2+j] = z[lags+j-i-1];
        }
    } 

    //mdisplay(x,lags,N1-lags+1);
    
    memcpy(Y,x,sizeof(double)*N2);

    for(i = 0; i < N2;++i) {
        tt[i] = (double) (i + lags);
    }
    

    if (lags > 1) {
        //lags 5
        p = lags + 2;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        memcpy(XX+2*N2,x+N2,sizeof(double)*N2*(lags-1));
        regress(fit,XX,Y,res,varcovar,alpha);
    } else {
        p = 3;
        XX = (double*)malloc(sizeof(double)*N2*p);
        varcovar = (double*)malloc(sizeof(double)*p*p);
        fit = reg_init(N2,p);
        memcpy(XX,y+lags-1,sizeof(double)*N2);
        memcpy(XX+N2,tt,sizeof(double)*N2);
        regress(fit,XX,Y,res,varcovar,alpha);
    }

    *statistic = (fit->beta+1)->value / (fit->beta+1)->stdErr;

    for(i = 0; i < pN;++i) {
        iter = i * tN;
        tablep[i] = interpolate_linear(nT,dftable+iter,tN,(double)N1);
    }

    interp = interpolate_linear(tablep,prob,pN,*statistic);

    //printf("interp %g \n",interp);

    if (!strcmp(alternative,"stationary")) {
        *pval = interp;
    } else if (!strcmp(alternative,"explosive")) {
        *pval = 1.0 - interp;
    } else {
        printf("alternative accepts only two values - stationary and explosive \n");
        exit(-1);
    }

    if (klag != NULL) *klag = lags - 1;
    

    free(z);
    free(x);
    free(res);
    free(Y);
    free(tt);
    free(XX);
    free(varcovar);
    free(tablep);
    free_reg(fit);
}